

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusPOMDPPlanner.cpp
# Opt level: O0

ValueFunctionPOMDPDiscrete * __thiscall
PerseusPOMDPPlanner::BackupStage
          (PerseusPOMDPPlanner *this,BeliefSet *S,ValueFunctionPOMDPDiscrete *V)

{
  bool bVar1;
  size_type sVar2;
  GaoVectorSet *Gao_00;
  const_reference ppJVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  reference pvVar5;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *this_00;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_RDX;
  long in_RSI;
  Perseus *in_RDI;
  double dVar6;
  reference rVar7;
  reference rVar8;
  int b;
  int nrImprovedByAlpha;
  double x;
  GaoVectorSet Gao;
  AlphaVector alpha;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  int k;
  int nrS;
  int nrNotImproved;
  int nrB;
  vector<double,_std::allocator<double>_> VBalpha;
  vector<double,_std::allocator<double>_> VB;
  ValueFunctionPOMDPDiscrete *V1;
  AlphaVectorPlanning *in_stack_fffffffffffffc88;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffc90;
  AlphaVector *in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  ostream *in_stack_fffffffffffffca8;
  AlphaVector *in_stack_fffffffffffffcb0;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffcb8;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffcc0;
  ostream *in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcd4;
  _Bit_type in_stack_fffffffffffffcd8;
  _Bit_type *in_stack_fffffffffffffce0;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcf4;
  _Bit_type in_stack_fffffffffffffcf8;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffd00;
  Perseus *in_stack_fffffffffffffd08;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffd10;
  BeliefSet *in_stack_fffffffffffffd18;
  long *plVar9;
  Perseus *this_01;
  reference local_208;
  _Bit_type *in_stack_fffffffffffffe08;
  _Bit_type in_stack_fffffffffffffe10;
  reference rVar10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  AlphaVector local_c8;
  byte local_9b;
  undefined1 local_99;
  int local_70;
  undefined4 local_5c;
  int local_58;
  int local_54;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> local_38;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  BeliefValue::GetValues(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x9253dc);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&local_38);
  local_58 = (int)sVar2;
  local_54 = local_58;
  AlphaVectorPlanning::GetPU(in_stack_fffffffffffffc88);
  Gao_00 = (GaoVectorSet *)PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffc90);
  local_5c = SUB84(Gao_00,0);
  local_99 = 1;
  std::allocator<bool>::allocator((allocator<bool> *)0x925472);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffcb0,
             (size_type)in_stack_fffffffffffffca8,(bool *)in_stack_fffffffffffffca0,
             (allocator_type *)in_stack_fffffffffffffc98);
  std::allocator<bool>::~allocator((allocator<bool> *)0x9254a6);
  local_9b = 0;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x9254bb);
  AlphaVector::AlphaVector(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
  Perseus::BackupStageLeadIn(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  rVar10._M_mask = in_stack_fffffffffffffe10;
  rVar10._M_p = in_stack_fffffffffffffe08;
  rVar7._M_mask = in_stack_fffffffffffffcf8;
  rVar7._M_p = (_Bit_type *)in_stack_fffffffffffffd00;
  rVar8._M_mask = in_stack_fffffffffffffcd8;
  rVar8._M_p = in_stack_fffffffffffffce0;
  if ((*(byte *)(in_RSI + 0x92) & 1) != 0) {
    local_70 = -1;
  }
  while (local_58 != 0) {
    if ((*(byte *)(in_RSI + 0x92) & 1) == 0) {
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)this_01,
                 (vector<bool,_std::allocator<bool>_> *)Gao_00);
      local_70 = Perseus::SampleNotImprovedBeliefIndex
                           ((Perseus *)rVar8._M_p,
                            (vector<bool,_std::allocator<bool>_> *)rVar8._M_mask,
                            in_stack_fffffffffffffcd4);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x925626);
    }
    else {
      local_70 = local_70 + 1;
    }
    std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::operator[]
              (local_18,(long)local_70);
    AlphaVectorPOMDP::BeliefBackup
              ((AlphaVectorPOMDP *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (JointBeliefInterface *)rVar10._M_mask,(GaoVectorSet *)rVar10._M_p);
    AlphaVector::operator=(in_stack_fffffffffffffc98,(AlphaVector *)in_stack_fffffffffffffc90);
    AlphaVector::~AlphaVector((AlphaVector *)0x9256c2);
    if ((*(byte *)(in_RSI + 0x92) & 1) == 0) {
      ppJVar3 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                operator[](local_18,(long)local_70);
      plVar9 = (long *)((long)&(*ppJVar3)->field_0x0 + *(long *)((long)**ppJVar3 + -0xb8));
      pvVar4 = AlphaVector::GetValues(&local_c8);
      dVar6 = (double)(**(code **)(*plVar9 + 0x80))(plVar9,pvVar4);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_70);
      if (dVar6 < *pvVar5) {
        BeliefValue::GetMaximizingVector
                  ((BeliefSet *)rVar7._M_mask,in_stack_fffffffffffffcf4,in_stack_fffffffffffffce8);
        AlphaVector::operator=(in_stack_fffffffffffffc98,(AlphaVector *)in_stack_fffffffffffffc90);
        AlphaVector::~AlphaVector((AlphaVector *)0x9257dc);
      }
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98);
    if ((*(byte *)(in_RSI + 0x92) & 1) == 0) {
      BeliefValue::GetValues
                ((BeliefSet *)in_stack_fffffffffffffcc8,(AlphaVector *)in_stack_fffffffffffffcc0);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc98);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0);
      in_stack_fffffffffffffe1c = 0;
      for (in_stack_fffffffffffffe18 = 0; in_stack_fffffffffffffe18 != local_54;
          in_stack_fffffffffffffe18 = in_stack_fffffffffffffe18 + 1) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffcb0,
                           (size_type)in_stack_fffffffffffffca8);
        rVar10 = rVar7;
        bVar1 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)&stack0xfffffffffffffe08);
        in_stack_fffffffffffffcf4 = in_stack_fffffffffffffcf4 & 0xffffff;
        if (bVar1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_50,(long)in_stack_fffffffffffffe18);
          in_stack_fffffffffffffce8 = (ValueFunctionPOMDPDiscrete *)*pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_38,(long)in_stack_fffffffffffffe18);
          in_stack_fffffffffffffcf4 =
               CONCAT13(*pvVar5 <= (double)in_stack_fffffffffffffce8,(int3)in_stack_fffffffffffffcf4
                       );
        }
        if ((char)(in_stack_fffffffffffffcf4 >> 0x18) != '\0') {
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffcb0,
                             (size_type)in_stack_fffffffffffffca8);
          local_208 = rVar8;
          std::_Bit_reference::operator=(&local_208,false);
          local_58 = local_58 + -1;
          in_stack_fffffffffffffe1c = in_stack_fffffffffffffe1c + 1;
        }
      }
      in_stack_fffffffffffffcd4 = Perseus::GetVerbose((Perseus *)(in_RSI + 8));
      if (-1 < in_stack_fffffffffffffcd4) {
        in_stack_fffffffffffffcc8 = std::operator<<((ostream *)&std::cout,"Added vector for ");
        in_stack_fffffffffffffcc0 =
             (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              *)std::ostream::operator<<(in_stack_fffffffffffffcc8,local_70);
        in_stack_fffffffffffffcb8 =
             (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              *)std::operator<<((ostream *)in_stack_fffffffffffffcc0," (V ");
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(long)local_70);
        in_stack_fffffffffffffcb0 =
             (AlphaVector *)std::ostream::operator<<(in_stack_fffffffffffffcb8,*pvVar5);
        in_stack_fffffffffffffca8 =
             std::operator<<((ostream *)in_stack_fffffffffffffcb0," improved ");
        in_stack_fffffffffffffca0 =
             (ostream *)
             std::ostream::operator<<(in_stack_fffffffffffffca8,in_stack_fffffffffffffe1c);
        in_stack_fffffffffffffc98 = (AlphaVector *)std::operator<<(in_stack_fffffffffffffca0,")");
        std::ostream::operator<<(in_stack_fffffffffffffc98,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      local_58 = local_58 + -1;
    }
  }
  this_00 = (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
             *)(in_RSI + 8);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  Perseus::BackupStageLeadOut(this_01,Gao_00);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(this_00);
  local_9b = 1;
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(this_00);
  AlphaVector::~AlphaVector((AlphaVector *)0x925b66);
  if ((local_9b & 1) == 0) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffca0);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x925bc9)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0);
  return (ValueFunctionPOMDPDiscrete *)in_RDI;
}

Assistant:

ValueFunctionPOMDPDiscrete
PerseusPOMDPPlanner::BackupStage(const BeliefSet &S,
                                 const ValueFunctionPOMDPDiscrete &V)
{
    vector<double> VB=BeliefValue::GetValues(S,V),
        VBalpha;
    int nrB=VB.size(),
        nrNotImproved=nrB,
        nrS=GetPU()->GetNrStates(),
        k;
    vector<bool> stillNeedToBeImproved(nrB,true);
    ValueFunctionPOMDPDiscrete V1;
    AlphaVector alpha(nrS);

    GaoVectorSet Gao=BackupStageLeadIn(V);

    if(_m_computeVectorForEachBelief)
        k=-1;

    while(nrNotImproved!=0)
    {
        if(_m_computeVectorForEachBelief)
            k++;
        else // sample a belief index from the number of not improved beliefs
            k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        alpha=BeliefBackup(*S[k],Gao);

        if(!_m_computeVectorForEachBelief)
        {
            // check whether alpha improves the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());
            // if not, get copy from old value function
            if(x<VB[k])
            {
                alpha=BeliefValue::GetMaximizingVector(S,k,V);
                
#if DEBUG_PerseusPOMDPPlanner
                cout << "Getting n-1 vector for " << k << endl;
#endif
            }
        }

        // add alpha to V1
        V1.push_back(alpha);

        if(_m_computeVectorForEachBelief)
            nrNotImproved--;
        else
        {
            // update which beliefs have been improved
            VBalpha=BeliefValue::GetValues(S,alpha);
            int nrImprovedByAlpha=0;
            for(int b=0;b!=nrB;b++)
                if(stillNeedToBeImproved[b] && VBalpha[b]>=VB[b])
                {
                    stillNeedToBeImproved[b]=false;
                    nrNotImproved--;
                    nrImprovedByAlpha++;
                }

            if(GetVerbose() >= 0)
                cout << "Added vector for " << k << " (V " << VBalpha[k] 
                     << " improved " << nrImprovedByAlpha << ")" << endl;
#if DEBUG_PerseusPOMDPPlanner
            alpha.Print();
            if(nrImprovedByAlpha==0)
                abort();
#endif
        }
    }

    BackupStageLeadOut(Gao);

    return(V1);
}